

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Waving.h
# Opt level: O0

void __thiscall
WavingSketch<8U,_1U,_4U>::Bucket::Insert
          (Bucket *this,Data<4U> *item,uint32_t seed_s,uint32_t seed_incast,bool *is_empty)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  Data<4U> *in_RSI;
  long in_RDI;
  undefined1 *in_R8;
  uint32_t min_choice;
  count_type counter_val;
  uint32_t i;
  uint32_t min_pos;
  count_type min_num;
  uint32_t whichcast;
  uint32_t choice;
  uint in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  uint local_34;
  uint local_30;
  int local_2c;
  
  uVar2 = Data<4U>::Hash((Data<4U> *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                         in_stack_ffffffffffffffac);
  uVar3 = uVar2 & 1;
  Data<4U>::Hash((Data<4U> *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 in_stack_ffffffffffffffac);
  local_2c = 0x7fffffff;
  local_30 = 0xffffffff;
  *in_R8 = 0;
  local_34 = 0;
  while( true ) {
    if (7 < local_34) {
      if (local_2c <= (int)*(short *)(in_RDI + 0x40) * COUNT[uVar3]) {
        if (*(int *)(in_RDI + 0x20 + (ulong)local_30 * 4) < 0) {
          uVar2 = Data<4U>::Hash((Data<4U> *)
                                 CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                                 in_stack_ffffffffffffffac);
          iVar4 = COUNT[uVar2 & 1] * *(int *)(in_RDI + 0x20 + (ulong)local_30 * 4);
          Data<4U>::Hash((Data<4U> *)CONCAT44(iVar4,in_stack_ffffffffffffffb0),
                         in_stack_ffffffffffffffac);
          *(short *)(in_RDI + 0x40) = *(short *)(in_RDI + 0x40) - (short)iVar4;
        }
        Data<4U>::operator=((Data<4U> *)(in_RDI + (ulong)local_30 * 4),in_RSI);
        *(int *)(in_RDI + 0x20 + (ulong)local_30 * 4) = local_2c + 1;
      }
      *(short *)(in_RDI + 0x40) = *(short *)(in_RDI + 0x40) + (short)COUNT[uVar3];
      return;
    }
    if (*(int *)(in_RDI + 0x20 + (ulong)local_34 * 4) == 0) break;
    bVar1 = Data<4U>::operator==((Data<4U> *)(in_RDI + (ulong)local_34 * 4),in_RSI);
    if (bVar1) {
      if (*(int *)(in_RDI + 0x20 + (ulong)local_34 * 4) < 0) {
        *(int *)(in_RDI + 0x20 + (ulong)local_34 * 4) =
             *(int *)(in_RDI + 0x20 + (ulong)local_34 * 4) + -1;
        return;
      }
      *(int *)(in_RDI + 0x20 + (ulong)local_34 * 4) =
           *(int *)(in_RDI + 0x20 + (ulong)local_34 * 4) + 1;
      *(short *)(in_RDI + 0x40) = *(short *)(in_RDI + 0x40) + (short)COUNT[uVar3];
      return;
    }
    iVar4 = *(int *)(in_RDI + 0x20 + (ulong)local_34 * 4);
    if (iVar4 < 1) {
      iVar4 = -iVar4;
    }
    if (iVar4 < local_2c) {
      local_30 = local_34;
      local_2c = iVar4;
    }
    local_34 = local_34 + 1;
  }
  Data<4U>::operator=((Data<4U> *)(in_RDI + (ulong)local_34 * 4),in_RSI);
  *(undefined4 *)(in_RDI + 0x20 + (ulong)local_34 * 4) = 0xffffffff;
  *in_R8 = 1;
  return;
}

Assistant:

void Insert(const Data<DATA_LEN>& item, uint32_t seed_s, uint32_t seed_incast, bool& is_empty) {
			uint32_t choice = item.Hash(seed_s) & 1;
			uint32_t whichcast = item.Hash(seed_incast) % counter_num;
			count_type min_num = INT_MAX;
			uint32_t min_pos = -1;
			is_empty = false;
			for (uint32_t i = 0; i < slot_num; ++i) {
				if (counters[i] == 0) {
					// The error free item's counter is negative, which is a trick to
					// be differentiated from items which are not error free.
					items[i] = item;
					counters[i] = -1;
					is_empty = true;
					return;
				}
				else if (items[i] == item) {
					if (counters[i] < 0)
						counters[i]--;
					else {
						counters[i]++;
						incast[whichcast] += COUNT[choice];
					}
					return;
				}

				count_type counter_val = std::abs(counters[i]);
				if (counter_val < min_num) {
					min_num = counter_val;
					min_pos = i;
				}
			}

			if (incast[whichcast] * COUNT[choice] >= int(min_num * factor)) {
				if (counters[min_pos] < 0) {
					uint32_t min_choice = items[min_pos].Hash(seed_s) & 1;
					incast[items[min_pos].Hash(seed_incast) % counter_num] -=
						COUNT[min_choice] * counters[min_pos];
				}
				items[min_pos] = item;
				counters[min_pos] = min_num + 1;
			}
			incast[whichcast] += COUNT[choice];
		}